

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[5],wabt::Type&,char_const(&)[4],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[6],wabt::(anonymous_namespace)::StackVar,char_const(&)[4],int,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [5],Type *args,char (*args_1) [4],SignedType *args_2,
          char (*args_3) [2],StackVar *args_4,char (*args_5) [6],StackVar *args_6,char (*args_7) [4]
          ,int *args_8,char (*args_9) [4],Newline *args_10)

{
  string_view local_60;
  SignedType *local_50;
  SignedType *args_local_2;
  char (*args_local_1) [4];
  Type *args_local;
  char (*u_local) [5];
  StackVar *t_local;
  CWriter *this_local;
  
  local_50 = args_2;
  args_local_2 = (SignedType *)args_1;
  args_local_1 = (char (*) [4])args;
  args_local = (Type *)u;
  u_local = (char (*) [5])t;
  t_local = (StackVar *)this;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_60);
  Write<wabt::Type&,char_const(&)[4],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[6],wabt::(anonymous_namespace)::StackVar,char_const(&)[4],int,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
            (this,(Type *)args_local_1,(char (*) [4])args_local_2,local_50,args_3,args_4,args_5,
             args_6,args_7,args_8,args_9,args_10);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }